

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

void checkformat(lua_State *L,char *form,char *flags,int precision)

{
  size_t sVar1;
  byte *pbVar2;
  ushort **ppuVar3;
  byte bVar4;
  
  sVar1 = strspn(form + 1,flags);
  bVar4 = 0x30;
  if (form[sVar1 + 1] != '0') {
    pbVar2 = (byte *)get2digits(form + sVar1 + 1);
    bVar4 = *pbVar2;
    if (precision != 0 && bVar4 == 0x2e) {
      pbVar2 = (byte *)get2digits((char *)(pbVar2 + 1));
      bVar4 = *pbVar2;
    }
  }
  ppuVar3 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar3 + (ulong)bVar4 * 2 + 1) & 4) == 0) {
    luaL_error(L,"invalid conversion specification: \'%s\'",form);
    return;
  }
  return;
}

Assistant:

static void checkformat (lua_State *L, const char *form, const char *flags,
                                       int precision) {
  const char *spec = form + 1;  /* skip '%' */
  spec += strspn(spec, flags);  /* skip flags */
  if (*spec != '0') {  /* a width cannot start with '0' */
    spec = get2digits(spec);  /* skip width */
    if (*spec == '.' && precision) {
      spec++;
      spec = get2digits(spec);  /* skip precision */
    }
  }
  if (!isalpha(uchar(*spec)))  /* did not go to the end? */
    luaL_error(L, "invalid conversion specification: '%s'", form);
}